

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

ON_String __thiscall ON_String::Right(ON_String *this,int count)

{
  char *pcVar1;
  int iVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  ON_String *this_00;
  int local_1c;
  int count_local;
  ON_String *this_local;
  ON_String *s;
  
  this_00 = (ON_String *)CONCAT44(in_register_00000034,count);
  ON_String(this);
  iVar2 = Length(this_00);
  local_1c = in_EDX;
  if (iVar2 < in_EDX) {
    local_1c = Length(this_00);
  }
  if (0 < local_1c) {
    pcVar1 = this_00->m_s;
    iVar2 = Length(this_00);
    CopyToArray(this,local_1c,pcVar1 + (iVar2 - local_1c));
  }
  return (ON_String)(char *)this;
}

Assistant:

ON_String ON_String::Right(int count) const
{
  ON_String s;
  if ( count > Length() )
    count = Length();
  if ( count > 0 ) {
    s.CopyToArray( count, &m_s[Length()-count] );
  }
  return s;
}